

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

pair<google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::InnerMap::iterator_base<const_google::protobuf::MapPair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_unsigned_long>
* __thiscall
google::protobuf::
Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
InnerMap::FindHelper<long>
          (pair<google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::InnerMap::iterator_base<const_google::protobuf::MapPair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_unsigned_long>
           *__return_storage_ptr__,InnerMap *this,long *k,TreeIterator *it)

{
  bool bVar1;
  LogMessage *other;
  const_iterator local_e8;
  _Base_ptr local_d0;
  iterator_base<const_google::protobuf::MapPair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  _Self local_b0;
  _Self local_a8;
  iterator tree_it;
  Tree *tree;
  byte local_81;
  LogMessage local_80;
  iterator_base<const_google::protobuf::MapPair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  Node *local_30;
  Node *node;
  size_type b;
  TreeIterator *it_local;
  long *k_local;
  InnerMap *this_local;
  
  b = (size_type)it;
  it_local = (TreeIterator *)k;
  k_local = (long *)this;
  node = (Node *)BucketNumber<long>(this,k);
  bVar1 = TableEntryIsNonEmptyList(this,(size_type)node);
  if (bVar1) {
    local_30 = (Node *)this->table_[(long)node];
    do {
      bVar1 = internal::TransparentSupport<long>::Equals((long *)local_30,(long *)it_local);
      if (bVar1) {
        iterator_base<const_google::protobuf::MapPair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::iterator_base(&local_48,local_30,this,(size_type)node);
        std::
        make_pair<google::protobuf::Map<long,std::__cxx11::string>::InnerMap::iterator_base<google::protobuf::MapPair<long,std::__cxx11::string>const>,unsigned_long&>
                  (__return_storage_ptr__,&local_48,(unsigned_long *)&node);
        return __return_storage_ptr__;
      }
      local_30 = local_30->next;
    } while (local_30 != (Node *)0x0);
    local_30 = (Node *)0x0;
  }
  else {
    bVar1 = TableEntryIsTree(this,(size_type)node);
    if (bVar1) {
      local_81 = 0;
      if (this->table_[(long)node] != this->table_[(ulong)node ^ 1]) {
        internal::LogMessage::LogMessage
                  (&local_80,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
                   ,0x314);
        local_81 = 1;
        other = internal::LogMessage::operator<<
                          (&local_80,"CHECK failed: (table_[b]) == (table_[b ^ 1]): ");
        internal::LogFinisher::operator=((LogFinisher *)((long)&tree + 3),other);
      }
      if ((local_81 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_80);
      }
      node = (Node *)((ulong)node & 0xfffffffffffffffe);
      tree_it._M_node = (_Base_ptr)this->table_[(long)node];
      local_a8._M_node =
           (_Base_ptr)
           std::
           map<long,_void_*,_std::less<long>,_google::protobuf::internal::MapAllocator<std::pair<const_long,_void_*>_>_>
           ::find((map<long,_void_*,_std::less<long>,_google::protobuf::internal::MapAllocator<std::pair<const_long,_void_*>_>_>
                   *)tree_it._M_node,(key_type *)it_local);
      local_b0._M_node =
           (_Base_ptr)
           std::
           map<long,_void_*,_std::less<long>,_google::protobuf::internal::MapAllocator<std::pair<const_long,_void_*>_>_>
           ::end(tree_it._M_node);
      bVar1 = std::operator!=(&local_a8,&local_b0);
      if (bVar1) {
        if (b != 0) {
          *(_Base_ptr *)b = local_a8._M_node;
        }
        local_d0 = local_a8._M_node;
        iterator_base<const_google::protobuf::MapPair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::iterator_base(&local_c8,(TreeIterator)local_a8._M_node,this,(size_type)node);
        std::
        make_pair<google::protobuf::Map<long,std::__cxx11::string>::InnerMap::iterator_base<google::protobuf::MapPair<long,std::__cxx11::string>const>,unsigned_long&>
                  (__return_storage_ptr__,&local_c8,(unsigned_long *)&node);
        return __return_storage_ptr__;
      }
    }
  }
  end(&local_e8,this);
  std::
  make_pair<google::protobuf::Map<long,std::__cxx11::string>::InnerMap::iterator_base<google::protobuf::MapPair<long,std::__cxx11::string>const>,unsigned_long&>
            (__return_storage_ptr__,&local_e8,(unsigned_long *)&node);
  return __return_storage_ptr__;
}

Assistant:

std::pair<const_iterator, size_type> FindHelper(const K& k,
                                                    TreeIterator* it) const {
      size_type b = BucketNumber(k);
      if (TableEntryIsNonEmptyList(b)) {
        Node* node = static_cast<Node*>(table_[b]);
        do {
          if (internal::TransparentSupport<Key>::Equals(node->kv.first, k)) {
            return std::make_pair(const_iterator(node, this, b), b);
          } else {
            node = node->next;
          }
        } while (node != nullptr);
      } else if (TableEntryIsTree(b)) {
        GOOGLE_DCHECK_EQ(table_[b], table_[b ^ 1]);
        b &= ~static_cast<size_t>(1);
        Tree* tree = static_cast<Tree*>(table_[b]);
        auto tree_it = tree->find(k);
        if (tree_it != tree->end()) {
          if (it != nullptr) *it = tree_it;
          return std::make_pair(const_iterator(tree_it, this, b), b);
        }
      }
      return std::make_pair(end(), b);
    }